

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingTools.hpp
# Opt level: O2

ostream * Diligent::Parsing::WriteToken<Diligent::Parsing::HLSLTokenInfo>
                    (ostream *stream,HLSLTokenInfo *Token)

{
  std::operator<<(stream,(string *)&Token->Delimiter);
  if (Token->Type == StringConstant) {
    std::operator<<(stream,"\"");
    std::operator<<(stream,(string *)&Token->Literal);
    std::operator<<(stream,"\"");
  }
  else {
    std::operator<<(stream,(string *)&Token->Literal);
  }
  return stream;
}

Assistant:

std::ostream& WriteToken(std::ostream& stream, const TokenClass& Token)
{
    Token.OutputDelimiter(stream);

    const auto Type = Token.GetType();
    using TokenType = decltype(Type);
    if (Type == TokenType::StringConstant)
        stream << "\"";
    Token.OutputLiteral(stream);
    if (Type == TokenType::StringConstant)
        stream << "\"";

    return stream;
}